

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O1

void __thiscall
CUI::DoPopupMenu(CUI *this,int X,int Y,int Width,int Height,void *pContext,
                _func_bool_void_ptr_CUIRect *pfnFunc,int Corners)

{
  anon_class_48_5_9f8a5a3d *paVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  float fVar5;
  
  dbg_assert_imp("/workspace/llm4binary/github/license_all_cmakelists_1510/TsFreddie[P]teeworlds/src/game/client/ui.cpp"
                 ,0x337,(uint)(this->m_NumPopupMenus < 8),"max popup menus exceeded");
  (this->m_Screen).h = 600.0;
  uVar2 = this->m_pGraphics->m_ScreenWidth;
  uVar3 = this->m_pGraphics->m_ScreenHeight;
  fVar5 = ((float)(int)uVar2 / (float)(int)uVar3) * 600.0;
  (this->m_Screen).w = fVar5;
  if (fVar5 < (float)(Width + X)) {
    (this->m_Screen).h = 600.0;
    (this->m_Screen).w = fVar5;
    X = (int)(fVar5 - (float)Width);
  }
  (this->m_Screen).h = 600.0;
  (this->m_Screen).w = fVar5;
  if (600 < Height + Y) {
    (this->m_Screen).h = 600.0;
    (this->m_Screen).w = fVar5;
    Y = (int)(600.0 - (float)Height);
  }
  uVar4 = this->m_NumPopupMenus;
  paVar1 = this->m_aPopupMenus + uVar4;
  (paVar1->m_Rect).x = (float)X;
  (paVar1->m_Rect).y = (float)Y;
  (paVar1->m_Rect).w = (float)Width;
  (paVar1->m_Rect).h = (float)Height;
  this->m_aPopupMenus[uVar4].m_Corners = Corners;
  this->m_aPopupMenus[uVar4].m_pContext = pContext;
  this->m_aPopupMenus[uVar4].m_pfnFunc = pfnFunc;
  this->m_aPopupMenus[uVar4].m_New = true;
  this->m_NumPopupMenus = uVar4 + 1;
  return;
}

Assistant:

void CUI::DoPopupMenu(int X, int Y, int Width, int Height, void *pContext, bool (*pfnFunc)(void *pContext, CUIRect View), int Corners)
{
	dbg_assert(m_NumPopupMenus < MAX_POPUP_MENUS, "max popup menus exceeded");

	if(X + Width > Screen()->w)
		X = Screen()->w - Width;
	if(Y + Height > Screen()->h)
		Y = Screen()->h - Height;

	m_aPopupMenus[m_NumPopupMenus].m_Rect.x = X;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.y = Y;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.w = Width;
	m_aPopupMenus[m_NumPopupMenus].m_Rect.h = Height;
	m_aPopupMenus[m_NumPopupMenus].m_Corners = Corners;
	m_aPopupMenus[m_NumPopupMenus].m_pContext = pContext;
	m_aPopupMenus[m_NumPopupMenus].m_pfnFunc = pfnFunc;
	m_aPopupMenus[m_NumPopupMenus].m_New = true;
	m_NumPopupMenus++;
}